

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O0

DVector3 * __thiscall
AActor::PosRelative(DVector3 *__return_storage_ptr__,AActor *this,sector_t *sec)

{
  undefined1 local_48 [40];
  sector_t *local_20;
  sector_t *sec_local;
  AActor *this_local;
  
  local_20 = sec;
  sec_local = (sector_t *)this;
  this_local = (AActor *)__return_storage_ptr__;
  Pos((DVector3 *)(local_48 + 0x10),this);
  FDisplacementTable::getOffset((FDisplacementTable *)local_48,0xd70d18,this->Sector->PortalGroup);
  operator+(__return_storage_ptr__,(TVector3<double> *)(local_48 + 0x10),(Vector2 *)local_48);
  return __return_storage_ptr__;
}

Assistant:

inline DVector3 AActor::PosRelative(sector_t *sec) const
{
	return Pos() + Displacements.getOffset(Sector->PortalGroup, sec->PortalGroup);
}